

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int nghttp2_stream_resume_deferred_item(nghttp2_stream *stream,uint8_t flags)

{
  uint8_t flags_local;
  nghttp2_stream *stream_local;
  
  if (stream->item != (nghttp2_outbound_item *)0x0) {
    stream->flags = stream->flags & (flags ^ 0xff);
    if ((stream->flags & 0xc) == 0) {
      if ((stream->flags & 0x10) == 0) {
        stream_local._4_4_ = stream_update_dep_on_attach_item(stream);
      }
      else {
        stream_local._4_4_ = 0;
      }
    }
    else {
      stream_local._4_4_ = 0;
    }
    return stream_local._4_4_;
  }
  __assert_fail("stream->item",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0x217,"int nghttp2_stream_resume_deferred_item(nghttp2_stream *, uint8_t)");
}

Assistant:

int nghttp2_stream_resume_deferred_item(nghttp2_stream *stream, uint8_t flags) {
  assert(stream->item);

  DEBUGF("stream: stream=%d resume item=%p flags=%02x\n", stream->stream_id,
         stream->item, flags);

  stream->flags = (uint8_t)(stream->flags & ~flags);

  if (stream->flags & NGHTTP2_STREAM_FLAG_DEFERRED_ALL) {
    return 0;
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return 0;
  }

  return stream_update_dep_on_attach_item(stream);
}